

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitTry(PrintExpressionContents *this,Try *curr)

{
  ostream *o;
  bool bVar1;
  Type local_40;
  Signature local_38;
  string_view local_28;
  Try *local_18;
  Try *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (Try *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"try");
  printMedium(o,local_28);
  bVar1 = IString::is(&(local_18->name).super_IString);
  if (bVar1) {
    std::operator<<(this->o,' ');
    wasm::Name::print(&local_18->name,this->o);
  }
  bVar1 = wasm::Type::isConcrete
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)52>).
                      super_Expression.type);
  if (bVar1) {
    std::operator<<(this->o,' ');
    wasm::Type::Type(&local_40,none);
    Signature::Signature
              (&local_38,local_40,
               (Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression
                     .type.id);
    printBlockType(this,local_38);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    printMedium(o, "try");
    if (curr->name.is()) {
      o << ' ';
      curr->name.print(o);
    }
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
  }